

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O3

int luaB_auxwrap(lua_State *L)

{
  int iVar1;
  lua_State *co;
  
  co = lua_tothread(L,-0xf4629);
  iVar1 = lua_gettop(L);
  iVar1 = auxresume(L,co,iVar1);
  if (-1 < iVar1) {
    return iVar1;
  }
  iVar1 = lua_type(L,-1);
  if (iVar1 == 4) {
    luaL_where(L,1);
    lua_rotate(L,-2,1);
    lua_concat(L,2);
  }
  iVar1 = lua_error(L);
  return iVar1;
}

Assistant:

static int luaB_auxwrap(lua_State *L) {
    lua_State *co = lua_tothread(L, lua_upvalueindex(1));
    int r = auxresume(L, co, lua_gettop(L));
    if (r < 0) {
        if (lua_type(L, -1) == LUA_TSTRING) {  /* error object is a string? */
            luaL_where(L, 1);  /* add extra info */
            lua_insert(L, -2);
            lua_concat(L, 2);
        }
        return lua_error(L);  /* propagate error */
    }
    return r;
}